

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypeParser.cpp
# Opt level: O3

BendType * __thiscall
OpenMD::BendTypeParser::parseLine(BendTypeParser *this,string *line,RealType kScale)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int iVar3;
  int myMatt;
  iterator iVar4;
  BendType *pBVar5;
  undefined8 *puVar6;
  mapped_type_conflict *pmVar7;
  OpenMDException *pOVar8;
  _Rb_tree_color _Var9;
  RealType RVar10;
  _func_int **pp_Var11;
  double dVar12;
  double dVar13;
  StringTokenizer tokenizer;
  double local_e8;
  string local_e0;
  _func_int **local_c0;
  RealType local_b8;
  _func_int **local_a8;
  _func_int **local_98;
  StringTokenizer local_90;
  _func_int **local_38;
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  local_b8 = kScale;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_90,line,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  uVar2 = StringTokenizer::countTokens(&local_90);
  if ((int)uVar2 < 2) {
    pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
    OpenMDException::OpenMDException(pOVar8,&local_e0);
    __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_e0,&local_90);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
                  *)this,&local_e0);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
    _Var9 = 10;
  }
  else {
    _Var9 = iVar4._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  switch(_Var9) {
  case _S_red:
    if (uVar2 == 2) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_e8 = StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x18);
    goto LAB_001d4dbf;
  case _S_black:
    if (uVar2 == 2) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_e8 = StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x18);
LAB_001d4dbf:
    pBVar5->theta0_ = local_e8 * 0.017453292519943295;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__BendType_00301b28;
    pBVar5[1]._vptr_BendType = (_func_int **)((double)local_a8 * local_b8);
    break;
  case 2:
    if (uVar2 < 5) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
    pp_Var11 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x30);
    pBVar5->theta0_ = local_b8 * 0.017453292519943295;
    pBVar5[1]._vptr_BendType = pp_Var11;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__UreyBradleyBendType_00301b78;
    pBVar5[2]._vptr_BendType = local_a8;
    pBVar5[1].theta0_ = (RealType)&PTR__BondType_00301bb8;
    pp_Var11 = local_c0;
    goto LAB_001d4ccd;
  case 3:
    if (uVar2 < 6) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
    pp_Var11 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_98 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x30);
    pBVar5->theta0_ = local_b8 * 0.017453292519943295;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__BendType_00301bf8;
    pBVar5[1]._vptr_BendType = pp_Var11;
    pBVar5[1].theta0_ = (RealType)local_a8;
    pBVar5[2]._vptr_BendType = local_c0;
    pp_Var11 = local_98;
LAB_001d4ccd:
    pBVar5[2].theta0_ = (RealType)pp_Var11;
    break;
  case 4:
    if (uVar2 < 7) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
    pp_Var11 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_98 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_38 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x38);
    pBVar5->theta0_ = local_b8 * 0.017453292519943295;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__BendType_00301c38;
    pBVar5[1]._vptr_BendType = pp_Var11;
    pBVar5[1].theta0_ = (RealType)local_a8;
    pBVar5[2]._vptr_BendType = local_c0;
    pBVar5[2].theta0_ = (RealType)local_98;
    pBVar5[3]._vptr_BendType = local_38;
    break;
  case 5:
    local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
    if ((uVar2 < 4) || ((uVar2 & 1) != 0)) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    puVar6 = (undefined8 *)operator_new(0x40);
    uVar2 = uVar2 - 2 >> 1;
    puVar6[1] = local_b8 * 0.017453292519943295;
    *puVar6 = &PTR__PolynomialBendType_00301c78;
    *(undefined4 *)(puVar6 + 3) = 0;
    pBVar5 = (BendType *)0x0;
    puVar6[4] = 0;
    puVar6[5] = puVar6 + 3;
    puVar6[6] = puVar6 + 3;
    puVar6[7] = 0;
    do {
      iVar3 = StringTokenizer::nextTokenAsInt(&local_90);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
      local_e0._M_dataplus._M_p._0_4_ = iVar3;
      pmVar7 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)(puVar6 + 2),(key_type *)&local_e0);
      *pmVar7 = local_b8;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    break;
  case 6:
    if (uVar2 == 2) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
    pp_Var11 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x20);
    pBVar5->theta0_ = local_b8 * 0.017453292519943295;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__BendType_00301cb8;
    pBVar5[1]._vptr_BendType = pp_Var11;
    dVar12 = cos(local_b8 * 0.017453292519943295);
    pBVar5[1].theta0_ = dVar12;
    break;
  case 7:
    if (uVar2 < 7) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_b8 = StringTokenizer::nextTokenAsDouble(&local_90);
    pp_Var11 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    iVar3 = StringTokenizer::nextTokenAsInt(&local_90);
    myMatt = StringTokenizer::nextTokenAsInt(&local_90);
    pBVar5 = (BendType *)operator_new(0x58);
    pBVar5->theta0_ = local_b8 * 0.017453292519943295;
    pBVar5[1]._vptr_BendType = pp_Var11;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__SDKBendType_00301cf8;
    ShiftedMieBondType::ShiftedMieBondType
              ((ShiftedMieBondType *)&pBVar5[1].theta0_,(RealType)local_a8,(RealType)local_c0,iVar3,
               myMatt);
    break;
  case 8:
    if (uVar2 == 2) {
      pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"BendTypeParser: Not enough tokens","");
      OpenMDException::OpenMDException(pOVar8,&local_e0);
      __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar10 = StringTokenizer::nextTokenAsDouble(&local_90);
    local_a8 = (_func_int **)StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x30);
    dVar12 = RVar10 * 0.017453292519943295;
    pBVar5->theta0_ = dVar12;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__BendType_00301d78;
    local_c0 = (_func_int **)sin(dVar12);
    dVar12 = cos(dVar12);
    dVar13 = 1.0 / ((double)local_c0 * 4.0 * (double)local_c0);
    pBVar5[2].theta0_ = dVar13;
    pBVar5[2]._vptr_BendType = (_func_int **)(dVar13 * -4.0 * dVar12);
    pBVar5[1]._vptr_BendType = (_func_int **)(local_b8 * (double)local_a8);
    pBVar5[1].theta0_ = ((dVar12 + dVar12) * dVar12 + 1.0) * dVar13;
    break;
  case 9:
    RVar10 = StringTokenizer::nextTokenAsDouble(&local_90);
    pBVar5 = (BendType *)operator_new(0x18);
    pBVar5->theta0_ = 0.0;
    pBVar5->_vptr_BendType = (_func_int **)&PTR__BendType_00301db8;
    pBVar5[1]._vptr_BendType = (_func_int **)(RVar10 * local_b8);
    break;
  default:
    pOVar8 = (OpenMDException *)__cxa_allocate_exception(0x28);
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"BendTypeParser: Unknown Bend Type","");
    OpenMDException::OpenMDException(pOVar8,&local_e0);
    __cxa_throw(pOVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.delim_._M_dataplus._M_p != &local_90.delim_.field_2) {
    operator_delete(local_90.delim_._M_dataplus._M_p,
                    local_90.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.tokenString_._M_dataplus._M_p != &local_90.tokenString_.field_2) {
    operator_delete(local_90.tokenString_._M_dataplus._M_p,
                    local_90.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return pBVar5;
}

Assistant:

BendType* BendTypeParser::parseLine(const std::string& line,
                                      RealType kScale) {
    StringTokenizer tokenizer(line);
    BendType* bendType = NULL;
    int nTokens        = tokenizer.countTokens();
    RealType theta0, ktheta;
    RealType deg2rad = Constants::PI / 180.0;

    if (nTokens < 2) {
      throw OpenMDException("BendTypeParser: Not enough tokens");
    }

    BendTypeEnum bt = getBendTypeEnum(tokenizer.nextToken());
    nTokens -= 1;

    // switch is a nightmare to maintain
    switch (bt) {
    case btHarmonic:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicBendType(theta0, ktheta);
      }
      break;
    case btGhostBend:
      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicBendType(theta0, ktheta);
      }
      break;

    case btUreyBradley:
      if (nTokens < 4) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0       = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta       = tokenizer.nextTokenAsDouble();
        RealType s0  = tokenizer.nextTokenAsDouble();
        RealType kub = tokenizer.nextTokenAsDouble();
        bendType     = new UreyBradleyBendType(theta0, ktheta, s0, kub);
      }
      break;

    case btCubic:
      if (nTokens < 5) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0      = tokenizer.nextTokenAsDouble() * deg2rad;
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bendType = new CubicBendType(theta0, k3, k2, k1, k0);
      }
      break;

    case btQuartic:
      if (nTokens < 6) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0      = tokenizer.nextTokenAsDouble() * deg2rad;
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bendType = new QuarticBendType(theta0, k4, k3, k2, k1, k0);
      }
      break;

    case btPolynomial: {
      theta0 = tokenizer.nextTokenAsDouble() * deg2rad;
      nTokens -= 1;
      if (nTokens < 2 || nTokens % 2 != 0) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        PolynomialBendType* pbt = new PolynomialBendType(theta0);

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble();
          pbt->setCoefficient(power, coefficient);
        }
      }
    } break;

    case btCosine:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble();
        bendType = new CosineBendType(theta0, ktheta);
      }
      break;

    case btSDK:
      if (nTokens < 6) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0           = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta           = tokenizer.nextTokenAsDouble();
        RealType sigma   = tokenizer.nextTokenAsDouble();
        RealType epsilon = tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();
        bendType = new SDKBendType(theta0, ktheta, sigma, epsilon, nRep, mAtt);
      }
      break;

    case btCosineSeries:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new CosineSeriesBendType(theta0, ktheta);
      }
      break;

    case btHarmonicSine:

      if (nTokens < 1) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicSineBendType(ktheta);
      }
      break;

    case btUnknown:
    default:
      throw OpenMDException("BendTypeParser: Unknown Bend Type");
    }

    return bendType;
  }